

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O2

bool QGifHandler::canRead(QIODevice *device)

{
  int iVar1;
  long lVar2;
  long in_FS_OFFSET;
  bool bVar3;
  char local_30 [4];
  undefined8 local_2c;
  undefined8 uStack_24;
  undefined4 local_1c;
  char *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    lcGif();
    if (((byte)lcGif::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0) {
      local_30[0] = '\x02';
      local_30[1] = '\0';
      local_30[2] = '\0';
      local_30[3] = '\0';
      local_2c = 0;
      uStack_24 = 0;
      local_1c = 0;
      local_18 = lcGif::category.name;
      bVar3 = false;
      QMessageLogger::warning(local_30,"QGifHandler::canRead() called with no device");
      goto LAB_0010493d;
    }
  }
  else {
    local_2c = CONCAT62(local_2c._2_6_,0xaaaa);
    local_30[0] = -0x56;
    local_30[1] = -0x56;
    local_30[2] = -0x56;
    local_30[3] = -0x56;
    lVar2 = QIODevice::peek((char *)device,(longlong)local_30);
    if (lVar2 == 6) {
      iVar1 = bcmp(local_30,"GIF87a",6);
      if (iVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp(local_30,"GIF89a",6);
        bVar3 = iVar1 == 0;
      }
      goto LAB_0010493d;
    }
  }
  bVar3 = false;
LAB_0010493d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QGifHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcGif, "QGifHandler::canRead() called with no device");
        return false;
    }

    char head[6];
    if (device->peek(head, sizeof(head)) == sizeof(head))
        return qstrncmp(head, "GIF87a", 6) == 0
            || qstrncmp(head, "GIF89a", 6) == 0;
    return false;
}